

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O0

path * get_executable_path_abi_cxx11_(void)

{
  vector<char,_std::allocator<char>_> *this;
  size_type sVar1;
  size_type sVar2;
  char *pcVar3;
  path *in_RDI;
  size_type last_slash;
  ssize_t len;
  vector<char,_std::allocator<char>_> path;
  string base_path;
  allocator *in_stack_fffffffffffffef0;
  size_type in_stack_fffffffffffffef8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  path *__s;
  string local_d8 [32];
  string local_b8 [32];
  long local_98;
  allocator local_89;
  string local_88 [32];
  size_type local_68;
  undefined1 local_59 [48];
  undefined1 local_29 [41];
  
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_29;
  __s = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar4,(char *)__s,(allocator<char> *)in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_59;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (allocator_type *)in_stack_fffffffffffffef0);
  std::allocator<char>::~allocator((allocator<char> *)local_59);
  do {
    this = (vector<char,_std::allocator<char>_> *)
           std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x11377d);
    sVar1 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)(local_59 + 1));
    sVar1 = readlink("/proc/self/exe",(char *)this,sVar1);
    local_68 = sVar1;
    if (sVar1 == 0xffffffffffffffff) {
LAB_00113982:
      std::operator+(pbVar4,(char *)this);
      std::filesystem::__cxx11::path::path(in_RDI,pbVar4,(format)((ulong)this >> 0x38));
      std::__cxx11::string::~string(local_d8);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffef0);
      std::__cxx11::string::~string((string *)(local_29 + 1));
      return __s;
    }
    sVar2 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)(local_59 + 1));
    if ((long)sVar1 < (long)sVar2) {
      pcVar3 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x11383f);
      sVar1 = local_68;
      in_stack_fffffffffffffef0 = &local_89;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,pcVar3,sVar1,in_stack_fffffffffffffef0);
      std::__cxx11::string::operator=((string *)(local_29 + 1),local_88);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      local_98 = std::__cxx11::string::find_last_of((char)local_29 + '\x01',0x2f);
      if (local_98 != -1) {
        std::__cxx11::string::substr((ulong)local_b8,(ulong)(local_29 + 1));
        std::__cxx11::string::operator=((string *)(local_29 + 1),local_b8);
        std::__cxx11::string::~string(local_b8);
      }
      goto LAB_00113982;
    }
    std::vector<char,_std::allocator<char>_>::size
              ((vector<char,_std::allocator<char>_> *)(local_59 + 1));
    std::vector<char,_std::allocator<char>_>::resize(this,sVar1);
  } while( true );
}

Assistant:

static fs::path get_executable_path() {
#if defined(__APPLE__)
    // get executable path
    std::vector<char> path;
    uint32_t size;
    while (true) {
        size = path.size();
        if (_NSGetExecutablePath(path.data(), &size) == 0) {
            break;
        }
        path.resize(size);
    }
    std::string base_path(path.data(), size);
    // remove executable name
    auto last_slash = base_path.find_last_of('/');
    if (last_slash != std::string::npos) {
        base_path = base_path.substr(0, last_slash);
    }
    return base_path + "/";
#elif defined(__linux__) || defined(__FreeBSD__)
    std::string base_path = ".";
    std::vector<char> path(1024);
    while (true) {
        // get executable path
#    if defined(__linux__)
        ssize_t len = readlink("/proc/self/exe", path.data(), path.size());
#    elif defined(__FreeBSD__)
        ssize_t len = readlink("/proc/curproc/file", path.data(), path.size());
#    endif
        if (len == -1) {
            break;
        }
        if (len < (ssize_t) path.size()) {
            base_path = std::string(path.data(), len);
            // remove executable name
            auto last_slash = base_path.find_last_of('/');
            if (last_slash != std::string::npos) {
                base_path = base_path.substr(0, last_slash);
            }
            break;
        }
        path.resize(path.size() * 2);
    }

    return base_path + "/";
#elif defined(_WIN32)
    std::vector<wchar_t> path(MAX_PATH);
    DWORD len = GetModuleFileNameW(NULL, path.data(), path.size());
    if (len == 0) {
        return {};
    }
    std::wstring base_path(path.data(), len);
    // remove executable name
    auto last_slash = base_path.find_last_of('\\');
    if (last_slash != std::string::npos) {
        base_path = base_path.substr(0, last_slash);
    }
    return base_path + L"\\";
#else
    return {};
#endif
}